

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O3

int __thiscall fmt::v7::file::close(file *this,int __fd)

{
  int in_EAX;
  system_error *this_00;
  int *piVar1;
  string_view message;
  
  if (this->fd_ != -1) {
    in_EAX = ::close(this->fd_);
    this->fd_ = -1;
    if (in_EAX != 0) {
      this_00 = (system_error *)__cxa_allocate_exception(0x18);
      piVar1 = __errno_location();
      message.size_ = 0x11;
      message.data_ = "cannot close file";
      system_error::system_error<>(this_00,*piVar1,message);
      __cxa_throw(this_00,&system_error::typeinfo,system_error::~system_error);
    }
  }
  return in_EAX;
}

Assistant:

void file::close() {
  if (fd_ == -1) return;
  // Don't retry close in case of EINTR!
  // See http://linux.derkeiler.com/Mailing-Lists/Kernel/2005-09/3000.html
  int result = FMT_POSIX_CALL(close(fd_));
  fd_ = -1;
  if (result != 0) FMT_THROW(system_error(errno, "cannot close file"));
}